

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O0

iterator_template<spvtools::opt::Instruction> __thiscall
spvtools::utils::IntrusiveList<spvtools::opt::Instruction>::
iterator_template<spvtools::opt::Instruction>::MoveBefore
          (iterator_template<spvtools::opt::Instruction> *this,
          IntrusiveList<spvtools::opt::Instruction> *list)

{
  Instruction *node;
  Instruction *pIVar1;
  bool bVar2;
  IntrusiveList<spvtools::opt::Instruction> *in_RDX;
  Instruction *last_node;
  Instruction *first_node;
  IntrusiveList<spvtools::opt::Instruction> *list_local;
  iterator_template<spvtools::opt::Instruction> *this_local;
  
  bVar2 = IntrusiveList<spvtools::opt::Instruction>::empty(in_RDX);
  if (bVar2) {
    iterator_template(this,(iterator_template<spvtools::opt::Instruction> *)list);
  }
  else {
    node = (in_RDX->sentinel_).super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    pIVar1 = (in_RDX->sentinel_).super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    *(Instruction **)(list->_vptr_IntrusiveList[2] + 8) = node;
    (node->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (Instruction *)list->_vptr_IntrusiveList[2];
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)list->_vptr_IntrusiveList;
    list->_vptr_IntrusiveList[2] = (_func_int *)pIVar1;
    (in_RDX->sentinel_).super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ =
         &in_RDX->sentinel_;
    (in_RDX->sentinel_).super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
         &in_RDX->sentinel_;
    iterator_template(this,node);
  }
  return (iterator_template<spvtools::opt::Instruction>)(Instruction *)this;
}

Assistant:

iterator_template MoveBefore(IntrusiveList* list) {
      if (list->empty()) return *this;

      NodeType* first_node = list->sentinel_.next_node_;
      NodeType* last_node = list->sentinel_.previous_node_;

      this->node_->previous_node_->next_node_ = first_node;
      first_node->previous_node_ = this->node_->previous_node_;

      last_node->next_node_ = this->node_;
      this->node_->previous_node_ = last_node;

      list->sentinel_.next_node_ = &list->sentinel_;
      list->sentinel_.previous_node_ = &list->sentinel_;

      return iterator(first_node);
    }